

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O1

void wipe_EndScreen(void)

{
  DFrameBuffer *pDVar1;
  int iVar2;
  ulong uVar3;
  
  pDVar1 = screen;
  if (CurrentWipeType != 0) {
    iVar2 = (screen->super_DSimpleCanvas).super_DCanvas.Height *
            (screen->super_DSimpleCanvas).super_DCanvas.Width;
    uVar3 = 0xffffffffffffffff;
    if (-2 < iVar2) {
      uVar3 = (long)(iVar2 / 2) * 2;
    }
    wipe_scr_end = (short *)operator_new__(uVar3);
    (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xc])
              (pDVar1,0,0,(ulong)(uint)(pDVar1->super_DSimpleCanvas).super_DCanvas.Width,
               (ulong)(uint)(pDVar1->super_DSimpleCanvas).super_DCanvas.Height,wipe_scr_end);
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xb])
              (screen,0,0,(ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
               (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Height,wipe_scr_start);
    (*wipes[CurrentWipeType * 3 + -3])(0);
    return;
  }
  return;
}

Assistant:

void wipe_EndScreen (void)
{
	if (CurrentWipeType)
	{
		wipe_scr_end = new short[SCREENWIDTH * SCREENHEIGHT / 2];
		screen->GetBlock (0, 0, SCREENWIDTH, SCREENHEIGHT, (BYTE *)wipe_scr_end);
		screen->DrawBlock (0, 0, SCREENWIDTH, SCREENHEIGHT, (BYTE *)wipe_scr_start); // restore start scr.
		// Initialize the wipe
		(*wipes[(CurrentWipeType-1)*3])(0);
	}
}